

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void output_astable(void)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  
  if (rflag == '\0') {
    outline = outline + 1;
    fwrite("#ifdef YYDESTRUCT\nstatic ",0x19,1,(FILE *)output_file);
  }
  if (accessing_symbol == (Yshort *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)(uint)*accessing_symbol;
  }
  fprintf((FILE *)output_file,"int yyastable[] = {%39d,",uVar1);
  if (1 < nstates) {
    iVar3 = 10;
    lVar2 = 1;
    do {
      if (iVar3 < 10) {
        iVar3 = iVar3 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar3 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)accessing_symbol[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < nstates);
  }
  if (rflag == '\0') {
    outline = outline + 3;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag != '\0') {
    return;
  }
  fwrite("#endif /* YYDESTRUCT */\n",0x18,1,(FILE *)output_file);
  return;
}

Assistant:

void output_astable()
{
    register int i;
    register int j;

    if (!rflag) {
	++outline;
	fprintf(output_file, "#ifdef YYDESTRUCT\nstatic ");
    }
    fprintf(output_file, "int yyastable[] = {%39d,", accessing_symbol ?
	    accessing_symbol[0] : 0);

    j = 10;
    for (i = 1; i < nstates; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	    ++j;

	fprintf(output_file, "%5d,", accessing_symbol[i]);
    }
    if (!rflag) outline += 3;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "#endif /* YYDESTRUCT */\n");
}